

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  pointer pcVar1;
  int iVar2;
  Error EVar3;
  WatchID WVar4;
  string local_50;
  
  if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) {
    pcVar1 = (directory->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + directory->_M_string_length);
    EVar3 = Errors::Log::createLastError(Unspecified,&local_50);
    WVar4 = (WatchID)EVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    Mutex::lock(&this->mInitLock);
    iVar2 = FileWatcherImpl::getOptionValue
                      (&this->super_FileWatcherImpl,options,LinuxProduceSyntheticEvents,0);
    WVar4 = addWatch(this,directory,watcher,recursive,iVar2 != 0,(WatcherInotify *)0x0,false);
    Mutex::unlock(&this->mInitLock);
  }
  return WVar4;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, const std::vector<WatcherOption>& options ) {
	if ( !mInitOK )
		return Errors::Log::createLastError( Errors::Unspecified, directory );
	Lock initLock( mInitLock );
	bool syntheticEvents = getOptionValue( options, Options::LinuxProduceSyntheticEvents, 0 ) != 0;
	return addWatch( directory, watcher, recursive, syntheticEvents, NULL );
}